

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O1

void __thiscall CTB<UF>::PerformLabeling(CTB<UF> *this)

{
  int iVar1;
  int *piVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar2 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar2,piVar2[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  UF::P_ = (uint *)operator_new__((ulong)(((*(int *)&pMVar3->field_0xc -
                                           (*(int *)&pMVar3->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                          ((*(int *)&pMVar3->field_0x8 -
                                           (*(int *)&pMVar3->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                  << 2);
  *UF::P_ = 0;
  UF::length_ = 1;
  uVar11 = (ulong)*(int *)&pMVar3->field_0x8;
  if (0 < (long)uVar11) {
    iVar1 = *(int *)&pMVar3->field_0xc;
    lVar14 = (long)iVar1;
    uVar15 = 0;
    do {
      if (0 < iVar1) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar23 = **(long **)&pMVar3->field_0x48;
        lVar18 = lVar23 * uVar15 + *(long *)&pMVar3->field_0x10;
        lVar19 = lVar18 - lVar23;
        lVar23 = lVar23 + lVar18;
        lVar21 = **(long **)&pMVar4->field_0x48;
        lVar24 = lVar21 * uVar15 + *(long *)&pMVar4->field_0x10;
        lVar5 = lVar24 - lVar21;
        lVar21 = lVar21 + lVar24;
        uVar22 = uVar15 | 1;
        uVar7 = 0xffffffff;
        lVar13 = 0;
        iVar12 = -1;
        do {
          switch(uVar7) {
          case 1:
            if (*(char *)(lVar18 + lVar13) != '\0') {
              if (uVar15 == 0) {
LAB_001a1466:
                if ((lVar13 == 0 || uVar15 == 0) || (*(char *)(lVar13 + -1 + lVar19) == '\0')) {
                  UF::P_[UF::length_] = UF::length_;
                  uVar9 = UF::length_ + 1;
                  *(uint *)(lVar24 + lVar13 * 4) = UF::length_;
                  UF::length_ = uVar9;
                }
                else {
                  *(undefined4 *)(lVar24 + lVar13 * 4) = *(undefined4 *)(lVar5 + -4 + lVar13 * 4);
                }
                iVar12 = 6;
              }
              else if (*(char *)(lVar19 + lVar13) == '\0') {
                if ((lVar14 <= lVar13 + 1) || (*(char *)(lVar19 + lVar13 + 1) == '\0'))
                goto LAB_001a1466;
                uVar9 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                *(uint *)(lVar24 + lVar13 * 4) = uVar9;
                iVar12 = 5;
                if ((lVar13 != 0) && (*(char *)(lVar13 + -1 + lVar19) != '\0')) {
                  do {
                    uVar16 = uVar9;
                    uVar8 = *(uint *)(lVar5 + -4 + lVar13 * 4);
                    uVar9 = UF::P_[uVar16];
                  } while (UF::P_[uVar16] < uVar16);
                  do {
                    uVar9 = uVar8;
                    uVar8 = UF::P_[uVar9];
                  } while (UF::P_[uVar9] < uVar9);
                  if (uVar16 < uVar9) {
                    UF::P_[uVar9] = uVar16;
                  }
                  else {
                    UF::P_[uVar16] = uVar9;
                  }
                }
              }
              else {
                *(undefined4 *)(lVar24 + lVar13 * 4) = *(undefined4 *)(lVar5 + lVar13 * 4);
                iVar12 = 4;
              }
              goto LAB_001a14b6;
            }
            uVar7 = 1;
            if ((uVar22 < uVar11) && (*(char *)(lVar23 + lVar13) != '\0')) {
              UF::P_[UF::length_] = UF::length_;
              uVar9 = UF::length_ + 1;
              *(uint *)(lVar21 + lVar13 * 4) = UF::length_;
              UF::length_ = uVar9;
              uVar7 = 3;
            }
            break;
          case 2:
            if (*(char *)(lVar18 + lVar13) != '\0') {
              uVar7 = 2;
              if (iVar12 == 6) {
                uVar9 = *(uint *)(lVar24 + -4 + lVar13 * 4);
                *(uint *)(lVar24 + lVar13 * 4) = uVar9;
                iVar12 = 6;
                if (((uVar15 != 0) && (lVar13 + 1 < lVar14)) &&
                   (*(char *)(lVar19 + lVar13 + 1) != '\0')) {
                  do {
                    uVar8 = uVar9;
                    uVar20 = (ulong)uVar8;
                    uVar9 = UF::P_[uVar20];
                    uVar16 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                  } while (UF::P_[uVar20] < uVar8);
                  do {
                    uVar9 = uVar16;
                    uVar17 = (ulong)uVar9;
                    uVar16 = UF::P_[uVar17];
                  } while (UF::P_[uVar17] < uVar9);
LAB_001a1875:
                  if (uVar8 < uVar9) {
                    UF::P_[uVar17] = uVar8;
                  }
                  else {
                    UF::P_[uVar20] = uVar9;
                  }
                  iVar12 = 5;
                }
              }
              else if (iVar12 == 5) {
LAB_001a10f3:
                *(undefined4 *)(lVar24 + lVar13 * 4) = *(undefined4 *)(lVar24 + -4 + lVar13 * 4);
                iVar12 = 5;
                uVar7 = 5;
              }
              else if (iVar12 == 4) {
                uVar9 = *(uint *)(lVar24 + -4 + lVar13 * 4);
                *(uint *)(lVar24 + lVar13 * 4) = uVar9;
                uVar7 = 4;
                iVar12 = 6;
                if (uVar15 != 0) {
                  bVar25 = *(char *)(lVar19 + lVar13) == '\0';
                  uVar16 = (uint)bVar25;
                  if (bVar25) {
                    if ((lVar13 + 1 < lVar14) && (*(char *)(lVar19 + lVar13 + 1) != '\0')) {
                      do {
                        uVar8 = uVar9;
                        uVar20 = (ulong)uVar8;
                        uVar9 = UF::P_[uVar20];
                        uVar16 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                      } while (UF::P_[uVar20] < uVar8);
                      do {
                        uVar9 = uVar16;
                        uVar17 = (ulong)uVar9;
                        uVar16 = UF::P_[uVar17];
                      } while (UF::P_[uVar17] < uVar9);
                      goto LAB_001a1875;
                    }
                  }
                  else {
LAB_001a10b8:
                    uVar7 = 4;
                    iVar12 = uVar16 * 2 + 4;
                  }
                }
              }
              goto LAB_001a1898;
            }
LAB_001a10c7:
            uVar7 = 1;
            if ((uVar22 < uVar11) && (*(char *)(lVar23 + lVar13) != '\0')) {
              *(undefined4 *)(lVar21 + lVar13 * 4) = *(undefined4 *)(lVar24 + -4 + lVar13 * 4);
              goto LAB_001a10e9;
            }
            break;
          case 3:
            if (*(char *)(lVar18 + lVar13) == '\0') goto LAB_001a103c;
            if (uVar15 != 0) {
              if (*(char *)(lVar19 + lVar13) != '\0') {
                uVar9 = *(uint *)(lVar5 + lVar13 * 4);
                *(uint *)(lVar24 + lVar13 * 4) = uVar9;
                do {
                  uVar8 = uVar9;
                  uVar20 = (ulong)uVar8;
                  uVar9 = UF::P_[uVar20];
                  uVar16 = *(uint *)(lVar21 + -4 + lVar13 * 4);
                } while (UF::P_[uVar20] < uVar8);
                do {
                  uVar9 = uVar16;
                  uVar17 = (ulong)uVar9;
                  uVar16 = UF::P_[uVar17];
                } while (UF::P_[uVar17] < uVar9);
LAB_001a102b:
                if (uVar8 < uVar9) {
                  UF::P_[uVar17] = uVar8;
                }
                else {
                  UF::P_[uVar20] = uVar9;
                }
                iVar12 = 4;
                goto LAB_001a182c;
              }
              if ((lVar13 + 1 < lVar14) && (*(char *)(lVar19 + lVar13 + 1) != '\0')) {
                uVar9 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                *(uint *)(lVar24 + lVar13 * 4) = uVar9;
                puVar10 = UF::P_;
                do {
                  uVar8 = uVar9;
                  uVar9 = UF::P_[uVar8];
                  uVar16 = *(uint *)(lVar21 + -4 + lVar13 * 4);
                } while (UF::P_[uVar8] < uVar8);
                do {
                  uVar9 = uVar16;
                  uVar16 = UF::P_[uVar9];
                } while (UF::P_[uVar9] < uVar9);
                uVar16 = uVar9;
                if (uVar8 >= uVar9 && uVar8 != uVar9) {
                  uVar16 = uVar8;
                }
                if (uVar8 < uVar9) {
                  uVar9 = uVar8;
                }
                UF::P_[uVar16] = uVar9;
                iVar12 = 5;
                if ((lVar13 != 0) && (*(char *)(lVar19 + -1 + lVar13) != '\0')) {
                  uVar9 = *(uint *)(lVar24 + lVar13 * 4);
                  do {
                    uVar8 = uVar9;
                    uVar20 = (ulong)uVar8;
                    uVar9 = puVar10[uVar20];
                    uVar16 = *(uint *)(lVar5 + -4 + lVar13 * 4);
                  } while (puVar10[uVar20] < uVar8);
                  do {
                    uVar9 = uVar16;
                    uVar17 = (ulong)uVar9;
                    uVar16 = puVar10[uVar17];
                  } while (puVar10[uVar17] < uVar9);
LAB_001a17a4:
                  iVar12 = 5;
                  if (uVar8 < uVar9) {
                    puVar10[uVar17] = uVar8;
                  }
                  else {
                    puVar10[uVar20] = uVar9;
                  }
                }
                goto LAB_001a182c;
              }
            }
            uVar9 = *(uint *)(lVar21 + -4 + lVar13 * 4);
            *(uint *)(lVar24 + lVar13 * 4) = uVar9;
            iVar12 = 6;
            if ((lVar13 != 0 && uVar15 != 0) && (*(char *)(lVar19 + -1 + lVar13) != '\0')) {
              do {
                uVar8 = uVar9;
                uVar20 = (ulong)uVar8;
                uVar9 = UF::P_[uVar20];
                uVar16 = *(uint *)(lVar5 + -4 + lVar13 * 4);
              } while (UF::P_[uVar20] < uVar8);
              do {
                uVar9 = uVar16;
                uVar17 = (ulong)uVar9;
                uVar16 = UF::P_[uVar17];
              } while (UF::P_[uVar17] < uVar9);
LAB_001a180e:
              iVar12 = 6;
              if (uVar8 < uVar9) {
                UF::P_[uVar17] = uVar8;
              }
              else {
                UF::P_[uVar20] = uVar9;
              }
            }
LAB_001a182c:
            uVar7 = 8;
            goto LAB_001a1898;
          case 4:
            if (*(char *)(lVar18 + lVar13) == '\0') goto LAB_001a10c7;
            uVar7 = 4;
            if (iVar12 == 6) {
              uVar9 = *(uint *)(lVar24 + -4 + lVar13 * 4);
              *(uint *)(lVar24 + lVar13 * 4) = uVar9;
              iVar12 = 6;
              if (((uVar15 != 0) && (lVar13 + 1 < lVar14)) &&
                 (*(char *)(lVar19 + lVar13 + 1) != '\0')) {
                do {
                  uVar8 = uVar9;
                  uVar20 = (ulong)uVar8;
                  uVar9 = UF::P_[uVar20];
                  uVar16 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                } while (UF::P_[uVar20] < uVar8);
                do {
                  uVar9 = uVar16;
                  uVar17 = (ulong)uVar9;
                  uVar16 = UF::P_[uVar17];
                } while (UF::P_[uVar17] < uVar9);
                goto LAB_001a1875;
              }
            }
            else {
              if (iVar12 == 5) goto LAB_001a10f3;
              if (iVar12 == 4) {
                uVar9 = *(uint *)(lVar24 + -4 + lVar13 * 4);
                *(uint *)(lVar24 + lVar13 * 4) = uVar9;
                iVar12 = 6;
                if (uVar15 != 0) {
                  bVar25 = *(char *)(lVar19 + lVar13) == '\0';
                  uVar16 = (uint)bVar25;
                  if (!bVar25) goto LAB_001a10b8;
                  if ((lVar13 + 1 < lVar14) && (*(char *)(lVar19 + lVar13 + 1) != '\0')) {
                    do {
                      uVar8 = uVar9;
                      uVar20 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar20];
                      uVar16 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                    } while (UF::P_[uVar20] < uVar8);
                    do {
                      uVar9 = uVar16;
                      uVar17 = (ulong)uVar9;
                      uVar16 = UF::P_[uVar17];
                    } while (UF::P_[uVar17] < uVar9);
                    goto LAB_001a1875;
                  }
                }
              }
            }
            goto LAB_001a1898;
          case 5:
            if (*(char *)(lVar18 + lVar13) == '\0') goto LAB_001a10c7;
            uVar9 = *(uint *)(lVar24 + -4 + lVar13 * 4);
            *(uint *)(lVar24 + lVar13 * 4) = uVar9;
            iVar12 = 6;
            if (uVar15 != 0) {
              bVar25 = *(char *)(lVar19 + lVar13) == '\0';
              if (bVar25) {
                if ((lVar13 + 1 < lVar14) && (*(char *)(lVar19 + lVar13 + 1) != '\0')) {
                  do {
                    uVar8 = uVar9;
                    uVar9 = UF::P_[uVar8];
                    uVar16 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                  } while (UF::P_[uVar8] < uVar8);
                  do {
                    uVar9 = uVar16;
                    uVar16 = UF::P_[uVar9];
                  } while (UF::P_[uVar9] < uVar9);
                  uVar16 = uVar9;
                  if (uVar8 >= uVar9 && uVar8 != uVar9) {
                    uVar16 = uVar8;
                  }
                  if (uVar8 < uVar9) {
                    uVar9 = uVar8;
                  }
                  UF::P_[uVar16] = uVar9;
                  iVar12 = 5;
                }
              }
              else {
                iVar12 = (uint)bVar25 * 2 + 4;
              }
            }
            uVar7 = 4;
            goto LAB_001a1898;
          case 6:
            if (*(char *)(lVar18 + lVar13) == '\0') goto LAB_001a10c7;
            if (iVar12 == 6) {
              uVar9 = *(uint *)(lVar24 + -4 + lVar13 * 4);
              *(uint *)(lVar24 + lVar13 * 4) = uVar9;
              uVar7 = 6;
              if (((uVar15 != 0) && (lVar13 + 1 < lVar14)) &&
                 (*(char *)(lVar19 + lVar13 + 1) != '\0')) {
                do {
                  uVar8 = uVar9;
                  uVar20 = (ulong)uVar8;
                  uVar9 = UF::P_[uVar20];
                  uVar16 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                } while (UF::P_[uVar20] < uVar8);
                do {
                  uVar9 = uVar16;
                  uVar17 = (ulong)uVar9;
                  uVar16 = UF::P_[uVar17];
                } while (UF::P_[uVar17] < uVar9);
                goto LAB_001a1875;
              }
              iVar12 = 6;
            }
            else {
              uVar7 = 6;
              if (iVar12 == 5) goto LAB_001a10f3;
            }
            goto LAB_001a1898;
          case 7:
            if (*(char *)(lVar18 + lVar13) != '\0') {
              if (uVar15 != 0) {
                if (*(char *)(lVar19 + lVar13) != '\0') {
                  uVar9 = *(uint *)(lVar5 + lVar13 * 4);
                  *(uint *)(lVar24 + lVar13 * 4) = uVar9;
                  do {
                    uVar8 = uVar9;
                    uVar20 = (ulong)uVar8;
                    uVar9 = UF::P_[uVar20];
                    uVar16 = *(uint *)(lVar21 + -4 + lVar13 * 4);
                  } while (UF::P_[uVar20] < uVar8);
                  do {
                    uVar9 = uVar16;
                    uVar17 = (ulong)uVar9;
                    uVar16 = UF::P_[uVar17];
                  } while (UF::P_[uVar17] < uVar9);
                  goto LAB_001a102b;
                }
                if ((lVar13 + 1 < lVar14) && (*(char *)(lVar19 + lVar13 + 1) != '\0')) {
                  uVar9 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                  *(uint *)(lVar24 + lVar13 * 4) = uVar9;
                  puVar10 = UF::P_;
                  do {
                    uVar8 = uVar9;
                    uVar9 = UF::P_[uVar8];
                    uVar16 = *(uint *)(lVar21 + -4 + lVar13 * 4);
                  } while (UF::P_[uVar8] < uVar8);
                  do {
                    uVar9 = uVar16;
                    uVar16 = UF::P_[uVar9];
                  } while (UF::P_[uVar9] < uVar9);
                  uVar16 = uVar9;
                  if (uVar8 >= uVar9 && uVar8 != uVar9) {
                    uVar16 = uVar8;
                  }
                  if (uVar8 < uVar9) {
                    uVar9 = uVar8;
                  }
                  UF::P_[uVar16] = uVar9;
                  iVar12 = 5;
                  if ((lVar13 != 0) && (*(char *)(lVar19 + -1 + lVar13) != '\0')) {
                    uVar9 = *(uint *)(lVar24 + lVar13 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar20 = (ulong)uVar8;
                      uVar9 = puVar10[uVar20];
                      uVar16 = *(uint *)(lVar5 + -4 + lVar13 * 4);
                    } while (puVar10[uVar20] < uVar8);
                    do {
                      uVar9 = uVar16;
                      uVar17 = (ulong)uVar9;
                      uVar16 = puVar10[uVar17];
                    } while (puVar10[uVar17] < uVar9);
                    goto LAB_001a17a4;
                  }
                  goto LAB_001a182c;
                }
              }
              uVar9 = *(uint *)(lVar21 + -4 + lVar13 * 4);
              *(uint *)(lVar24 + lVar13 * 4) = uVar9;
              iVar12 = 6;
              if ((lVar13 != 0 && uVar15 != 0) && (*(char *)(lVar19 + -1 + lVar13) != '\0')) {
                do {
                  uVar8 = uVar9;
                  uVar20 = (ulong)uVar8;
                  uVar9 = UF::P_[uVar20];
                  uVar16 = *(uint *)(lVar5 + -4 + lVar13 * 4);
                } while (UF::P_[uVar20] < uVar8);
                do {
                  uVar9 = uVar16;
                  uVar17 = (ulong)uVar9;
                  uVar16 = UF::P_[uVar17];
                } while (UF::P_[uVar17] < uVar9);
                goto LAB_001a180e;
              }
              goto LAB_001a182c;
            }
            goto LAB_001a103c;
          case 8:
            if (*(char *)(lVar18 + lVar13) == '\0') goto LAB_001a10c7;
            uVar7 = 8;
            if (iVar12 == 6) {
              uVar9 = *(uint *)(lVar24 + -4 + lVar13 * 4);
              *(uint *)(lVar24 + lVar13 * 4) = uVar9;
              iVar12 = 6;
              if (((uVar15 != 0) && (lVar13 + 1 < lVar14)) &&
                 (*(char *)(lVar19 + lVar13 + 1) != '\0')) {
                do {
                  uVar8 = uVar9;
                  uVar20 = (ulong)uVar8;
                  uVar9 = UF::P_[uVar20];
                  uVar16 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                } while (UF::P_[uVar20] < uVar8);
                do {
                  uVar9 = uVar16;
                  uVar17 = (ulong)uVar9;
                  uVar16 = UF::P_[uVar17];
                } while (UF::P_[uVar17] < uVar9);
                goto LAB_001a1875;
              }
            }
            else {
              if (iVar12 == 5) goto LAB_001a10f3;
              if (iVar12 == 4) {
                uVar9 = *(uint *)(lVar24 + -4 + lVar13 * 4);
                *(uint *)(lVar24 + lVar13 * 4) = uVar9;
                uVar7 = 4;
                iVar12 = 6;
                if (uVar15 != 0) {
                  bVar25 = *(char *)(lVar19 + lVar13) == '\0';
                  uVar16 = (uint)bVar25;
                  if (!bVar25) goto LAB_001a10b8;
                  if ((lVar13 + 1 < lVar14) && (*(char *)(lVar19 + lVar13 + 1) != '\0')) {
                    do {
                      uVar8 = uVar9;
                      uVar20 = (ulong)uVar8;
                      uVar9 = UF::P_[uVar20];
                      uVar16 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                    } while (UF::P_[uVar20] < uVar8);
                    do {
                      uVar9 = uVar16;
                      uVar17 = (ulong)uVar9;
                      uVar16 = UF::P_[uVar17];
                    } while (UF::P_[uVar17] < uVar9);
                    goto LAB_001a1875;
                  }
                }
              }
            }
LAB_001a1898:
            if ((uVar22 < uVar11) && (*(char *)(lVar23 + lVar13) != '\0')) {
              *(undefined4 *)(lVar21 + lVar13 * 4) = *(undefined4 *)(lVar24 + lVar13 * 4);
            }
            break;
          case 9:
            if (*(char *)(lVar18 + lVar13) != '\0') {
              if (uVar15 != 0) {
                if (*(char *)(lVar19 + lVar13) != '\0') {
                  uVar9 = *(uint *)(lVar5 + lVar13 * 4);
                  *(uint *)(lVar24 + lVar13 * 4) = uVar9;
                  do {
                    uVar8 = uVar9;
                    uVar20 = (ulong)uVar8;
                    uVar9 = UF::P_[uVar20];
                    uVar16 = *(uint *)(lVar21 + -4 + lVar13 * 4);
                  } while (UF::P_[uVar20] < uVar8);
                  do {
                    uVar9 = uVar16;
                    uVar17 = (ulong)uVar9;
                    uVar16 = UF::P_[uVar17];
                  } while (UF::P_[uVar17] < uVar9);
                  goto LAB_001a102b;
                }
                if ((lVar13 + 1 < lVar14) && (*(char *)(lVar19 + lVar13 + 1) != '\0')) {
                  uVar9 = *(uint *)(lVar5 + 4 + lVar13 * 4);
                  *(uint *)(lVar24 + lVar13 * 4) = uVar9;
                  puVar10 = UF::P_;
                  do {
                    uVar8 = uVar9;
                    uVar9 = UF::P_[uVar8];
                    uVar16 = *(uint *)(lVar21 + -4 + lVar13 * 4);
                  } while (UF::P_[uVar8] < uVar8);
                  do {
                    uVar9 = uVar16;
                    uVar16 = UF::P_[uVar9];
                  } while (UF::P_[uVar9] < uVar9);
                  uVar16 = uVar9;
                  if (uVar8 >= uVar9 && uVar8 != uVar9) {
                    uVar16 = uVar8;
                  }
                  if (uVar8 < uVar9) {
                    uVar9 = uVar8;
                  }
                  UF::P_[uVar16] = uVar9;
                  iVar12 = 5;
                  if ((lVar13 != 0) && (*(char *)(lVar19 + -1 + lVar13) != '\0')) {
                    uVar9 = *(uint *)(lVar24 + lVar13 * 4);
                    do {
                      uVar8 = uVar9;
                      uVar20 = (ulong)uVar8;
                      uVar9 = puVar10[uVar20];
                      uVar16 = *(uint *)(lVar5 + -4 + lVar13 * 4);
                    } while (puVar10[uVar20] < uVar8);
                    do {
                      uVar9 = uVar16;
                      uVar17 = (ulong)uVar9;
                      uVar16 = puVar10[uVar17];
                    } while (puVar10[uVar17] < uVar9);
                    goto LAB_001a17a4;
                  }
                  goto LAB_001a182c;
                }
              }
              lVar6 = lVar13 + -1;
              uVar9 = *(uint *)(lVar21 + lVar6 * 4);
              *(uint *)(lVar24 + lVar13 * 4) = uVar9;
              iVar12 = 6;
              if ((lVar13 != 0 && uVar15 != 0) && (*(char *)(lVar19 + lVar6) != '\0')) {
                do {
                  uVar8 = uVar9;
                  uVar20 = (ulong)uVar8;
                  uVar9 = UF::P_[uVar20];
                  uVar16 = *(uint *)(lVar5 + lVar6 * 4);
                } while (UF::P_[uVar20] < uVar8);
                do {
                  uVar9 = uVar16;
                  uVar17 = (ulong)uVar9;
                  uVar16 = UF::P_[uVar17];
                } while (UF::P_[uVar17] < uVar9);
                goto LAB_001a180e;
              }
              goto LAB_001a182c;
            }
LAB_001a103c:
            uVar7 = 1;
            if ((uVar22 < uVar11) && (*(char *)(lVar23 + lVar13) != '\0')) {
              *(undefined4 *)(lVar21 + lVar13 * 4) = *(undefined4 *)(lVar21 + -4 + lVar13 * 4);
              uVar7 = 9;
            }
            break;
          case 0xffffffff:
            if (*(char *)(lVar18 + lVar13) != '\0') {
              if (uVar15 == 0) {
LAB_001a13bc:
                UF::P_[UF::length_] = UF::length_;
                iVar12 = 6;
                uVar9 = UF::length_;
                UF::length_ = UF::length_ + 1;
              }
              else if (*(char *)(lVar19 + lVar13) == '\0') {
                if ((lVar14 <= lVar13 + 1) || (*(char *)(lVar19 + lVar13 + 1) == '\0'))
                goto LAB_001a13bc;
                iVar12 = 5;
                uVar9 = *(uint *)(lVar5 + 4 + lVar13 * 4);
              }
              else {
                iVar12 = 4;
                uVar9 = *(uint *)(lVar5 + lVar13 * 4);
              }
              *(uint *)(lVar24 + lVar13 * 4) = uVar9;
LAB_001a14b6:
              uVar7 = 2;
              goto LAB_001a1898;
            }
            uVar7 = 1;
            if ((uVar11 <= uVar22) || (*(char *)(lVar23 + lVar13) == '\0')) break;
            UF::P_[UF::length_] = UF::length_;
            uVar9 = UF::length_ + 1;
            *(uint *)(lVar21 + lVar13 * 4) = UF::length_;
            UF::length_ = uVar9;
LAB_001a10e9:
            uVar7 = 7;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar14);
      }
      uVar15 = uVar15 + 2;
    } while (uVar15 < uVar11);
  }
  puVar10 = UF::P_;
  uVar9 = 1;
  if (1 < UF::length_) {
    uVar11 = 1;
    do {
      if (puVar10[uVar11] < uVar11) {
        puVar10[uVar11] = puVar10[puVar10[uVar11]];
      }
      else {
        puVar10[uVar11] = uVar9;
        uVar9 = uVar9 + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < UF::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
  puVar10 = UF::P_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar4->field_0x8) {
    lVar14 = *(long *)&pMVar4->field_0x10;
    lVar23 = **(long **)&pMVar4->field_0x48;
    lVar21 = 0;
    do {
      iVar1 = *(int *)&pMVar4->field_0xc;
      if ((long)iVar1 != 0) {
        lVar5 = 0;
        do {
          *(uint *)(lVar14 + lVar5) = puVar10[*(uint *)(lVar14 + lVar5)];
          lVar5 = lVar5 + 4;
        } while ((long)iVar1 * 4 != lVar5);
      }
      lVar21 = lVar21 + 1;
      lVar14 = lVar14 + lVar23;
    } while (lVar21 < *(int *)&pMVar4->field_0x8);
  }
  if (UF::P_ != (uint *)0x0) {
    operator_delete__(UF::P_);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int *img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }